

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_text_char(nk_str *s,char *str,int len)

{
  int iVar1;
  void *dst0;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  char *mem;
  nk_size in_stack_00000020;
  nk_size in_stack_00000028;
  nk_buffer_allocation_type in_stack_00000034;
  nk_buffer *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI == 0) || (in_RSI == (void *)0x0)) || (in_EDX == 0)) {
    in_EDX = 0;
  }
  else {
    dst0 = nk_buffer_alloc(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
    if (dst0 == (void *)0x0) {
      in_EDX = 0;
    }
    else {
      nk_memcopy(dst0,in_RSI,(long)in_EDX);
      iVar1 = nk_utf_len((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (int)((ulong)in_RDI >> 0x20));
      *(int *)(in_RDI + 0x78) = iVar1 + *(int *)(in_RDI + 0x78);
    }
  }
  return in_EDX;
}

Assistant:

NK_API int
nk_str_append_text_char(struct nk_str *s, const char *str, int len)
{
    char *mem;
    NK_ASSERT(s);
    NK_ASSERT(str);
    if (!s || !str || !len) return 0;
    mem = (char*)nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
    if (!mem) return 0;
    NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
    s->len += nk_utf_len(str, len);
    return len;
}